

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

void smallest_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (n < 1) {
    *accum = 0x7ffffffe;
    iVar2 = 0x7ffffffe;
  }
  else {
    iVar2 = *vals;
    *accum = iVar2;
    if (n != 1) {
      uVar3 = 1;
      do {
        iVar1 = vals[uVar3];
        if (iVar1 != 0x7ffffffe) {
          if (iVar1 == 0x7fffffff) {
            if (iVar2 == 0x7ffffffe) {
LAB_001de17d:
              *accum = iVar1;
              iVar2 = iVar1;
            }
          }
          else if (0x7ffffffd < iVar2 || iVar1 < iVar2) goto LAB_001de17d;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
      if (n < 1) {
        *accum_aux = 0x7ffffffe;
        iVar2 = 0x7ffffffe;
      }
      else {
        iVar2 = *auxs;
        *accum_aux = iVar2;
        if (n == 1) {
          return;
        }
      }
      uVar3 = 1;
      do {
        iVar1 = auxs[uVar3];
        if (iVar1 != 0x7ffffffe) {
          if (iVar1 == 0x7fffffff) {
            if (iVar2 == 0x7ffffffe) {
LAB_001de1e2:
              *accum_aux = iVar1;
              iVar2 = iVar1;
            }
          }
          else if (0x7ffffffd < iVar2 || iVar1 < iVar2) goto LAB_001de1e2;
        }
        uVar3 = uVar3 + 1;
        if ((uint)n == uVar3) {
          return;
        }
      } while( true );
    }
    iVar2 = *auxs;
  }
  *accum_aux = iVar2;
  return;
}

Assistant:

static void smallest_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = (n > 0) ? vals[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		smallest_combine_accum_help(vals[i], accum);
	}

	*accum_aux = (n > 0) ? auxs[0] : UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 1; i < n; ++i) {
		smallest_combine_accum_help(auxs[i], accum_aux);
	}
}